

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vncipher_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  byte abStack_38 [8];
  ppc_avr_t tmp;
  int i;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  
  for (tmp.u32[3] = 0xf; -1 < tmp.s32[3]; tmp.u32[3] = tmp.u32[3] - 1) {
    abStack_38[0xf - tmp._12_4_] =
         b->u8[0xf - tmp._12_4_] ^ AES_isbox[a->u8[(int)(0xf - (uint)""[tmp.s32[3]])]];
  }
  for (tmp.u32[3] = 3; -1 < tmp.s32[3]; tmp.u32[3] = tmp.u32[3] - 1) {
    r->u32[3 - tmp._12_4_] =
         AES_imc[abStack_38[(int)(tmp.u32[3] * -4 + 0xf)]][0] ^
         AES_imc[abStack_38[(int)(0xf - (tmp.u32[3] * 4 + 1))]][1] ^
         AES_imc[abStack_38[(int)(0xf - (tmp.u32[3] * 4 + 2))]][2] ^
         AES_imc[abStack_38[(int)(0xf - (tmp.u32[3] * 4 + 3))]][3];
  }
  return;
}

Assistant:

void helper_vncipher(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    /* This differs from what is written in ISA V2.07.  The RTL is */
    /* incorrect and will be fixed in V2.07B.                      */
    int i;
    ppc_avr_t tmp;

    VECTOR_FOR_INORDER_I(i, u8) {
        tmp.VsrB(i) = b->VsrB(i) ^ AES_isbox[a->VsrB(AES_ishifts[i])];
    }

    VECTOR_FOR_INORDER_I(i, u32) {
        r->VsrW(i) =
            AES_imc[tmp.VsrB(4 * i + 0)][0] ^
            AES_imc[tmp.VsrB(4 * i + 1)][1] ^
            AES_imc[tmp.VsrB(4 * i + 2)][2] ^
            AES_imc[tmp.VsrB(4 * i + 3)][3];
    }
}